

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O3

void advance_engine<trng::mt19937>(mt19937 *r1,mt19937 *r2,long N)

{
  long lVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  result_type rVar5;
  
  if (0 < N) {
    lVar1 = 0;
    do {
      iVar2 = (r1->S).mti;
      if (0x26f < iVar2) {
        rVar5 = (r1->S).mt[0];
        lVar3 = 0;
        do {
          uVar4 = rVar5 & 0x80000000;
          rVar5 = (r1->S).mt[lVar3 + 1];
          (r1->S).mt[lVar3] =
               *(uint *)(&DAT_002a6fcc + (ulong)(rVar5 & 1) * 4) ^ (r1->S).mt[lVar3 + 0x18d] ^
               (rVar5 & 0x7ffffffe | uVar4) >> 1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0xe3);
        rVar5 = (r1->S).mt[0xe3];
        lVar3 = 0;
        do {
          uVar4 = rVar5 & 0x80000000;
          rVar5 = (r1->S).mt[lVar3 + 0xe4];
          (r1->S).mt[lVar3 + 0xe3] =
               *(uint *)(&DAT_002a6fcc + (ulong)(rVar5 & 1) * 4) ^ (r1->S).mt[lVar3] ^
               (rVar5 & 0x7ffffffe | uVar4) >> 1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x18c);
        uVar4 = (r1->S).mt[0];
        (r1->S).mt[0x26f] =
             *(uint *)(&DAT_002a6fcc + (ulong)(uVar4 & 1) * 4) ^ (r1->S).mt[0x18c] ^
             (uVar4 & 0x7ffffffe | (r1->S).mt[0x26f] & 0x80000000) >> 1;
        iVar2 = 0;
      }
      (r1->S).mti = iVar2 + 1;
      iVar2 = (r2->S).mti;
      if (0x26f < iVar2) {
        rVar5 = (r2->S).mt[0];
        lVar3 = 0;
        do {
          uVar4 = rVar5 & 0x80000000;
          rVar5 = (r2->S).mt[lVar3 + 1];
          (r2->S).mt[lVar3] =
               *(uint *)(&DAT_002a6fcc + (ulong)(rVar5 & 1) * 4) ^ (r2->S).mt[lVar3 + 0x18d] ^
               (rVar5 & 0x7ffffffe | uVar4) >> 1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0xe3);
        rVar5 = (r2->S).mt[0xe3];
        lVar3 = 0;
        do {
          uVar4 = rVar5 & 0x80000000;
          rVar5 = (r2->S).mt[lVar3 + 0xe4];
          (r2->S).mt[lVar3 + 0xe3] =
               *(uint *)(&DAT_002a6fcc + (ulong)(rVar5 & 1) * 4) ^ (r2->S).mt[lVar3] ^
               (rVar5 & 0x7ffffffe | uVar4) >> 1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x18c);
        uVar4 = (r2->S).mt[0];
        (r2->S).mt[0x26f] =
             *(uint *)(&DAT_002a6fcc + (ulong)(uVar4 & 1) * 4) ^ (r2->S).mt[0x18c] ^
             (uVar4 & 0x7ffffffe | (r2->S).mt[0x26f] & 0x80000000) >> 1;
        iVar2 = 0;
      }
      (r2->S).mti = iVar2 + 1;
      lVar1 = lVar1 + 1;
    } while (lVar1 != N);
  }
  return;
}

Assistant:

void advance_engine(R &r1, R &r2, const long N) {
  for (long i{0}; i < N; ++i) {
    r1();
    r2();
  }
}